

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

void png_handle_tEXt(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  png_uint_32 pVar1;
  int iVar2;
  png_bytep ppStack_70;
  png_uint_32 skip;
  png_charp text;
  png_charp key;
  png_bytep buffer;
  png_text text_info;
  png_uint_32 length_local;
  png_inforp info_ptr_local;
  png_structrp png_ptr_local;
  
  text_info.lang_key._4_4_ = length;
  if (png_ptr->user_chunk_cache_max != 0) {
    if (png_ptr->user_chunk_cache_max == 1) {
      png_crc_finish(png_ptr,length);
      return;
    }
    pVar1 = png_ptr->user_chunk_cache_max - 1;
    png_ptr->user_chunk_cache_max = pVar1;
    if (pVar1 == 1) {
      png_crc_finish(png_ptr,length);
      png_chunk_benign_error(png_ptr,"no space in chunk cache");
      return;
    }
  }
  if ((png_ptr->mode & 1) != 0) {
    if ((png_ptr->mode & 4) != 0) {
      png_ptr->mode = png_ptr->mode | 8;
    }
    text_info._0_8_ = png_read_buffer(png_ptr,(ulong)(length + 1),1);
    if ((png_bytep)text_info._0_8_ == (png_bytep)0x0) {
      png_chunk_benign_error(png_ptr,"out of memory");
    }
    else {
      png_crc_read(png_ptr,(png_bytep)text_info._0_8_,text_info.lang_key._4_4_);
      iVar2 = png_crc_finish(png_ptr,0);
      if (iVar2 == 0) {
        *(png_byte *)(text_info._0_8_ + (ulong)text_info.lang_key._4_4_) = '\0';
        for (ppStack_70 = (png_bytep)text_info._0_8_; *ppStack_70 != '\0';
            ppStack_70 = ppStack_70 + 1) {
        }
        if (ppStack_70 != (png_bytep)(text_info._0_8_ + (ulong)text_info.lang_key._4_4_)) {
          ppStack_70 = ppStack_70 + 1;
        }
        buffer._0_4_ = 0xffffffff;
        text_info.itxt_length = 0;
        text_info.lang = (png_charp)0x0;
        text_info.text_length = 0;
        text_info.key = (png_charp)ppStack_70;
        text_info.text = (png_charp)strlen((char *)ppStack_70);
        iVar2 = png_set_text_2(png_ptr,info_ptr,(png_const_textp)&buffer,1);
        if (iVar2 != 0) {
          png_warning(png_ptr,"Insufficient memory to process text chunk");
        }
      }
    }
    return;
  }
  png_chunk_error(png_ptr,"missing IHDR");
}

Assistant:

void /* PRIVATE */
png_handle_tEXt(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   png_text  text_info;
   png_bytep buffer;
   png_charp key;
   png_charp text;
   png_uint_32 skip = 0;

   png_debug(1, "in png_handle_tEXt");

#ifdef PNG_USER_LIMITS_SUPPORTED
   if (png_ptr->user_chunk_cache_max != 0)
   {
      if (png_ptr->user_chunk_cache_max == 1)
      {
         png_crc_finish(png_ptr, length);
         return;
      }

      if (--png_ptr->user_chunk_cache_max == 1)
      {
         png_crc_finish(png_ptr, length);
         png_chunk_benign_error(png_ptr, "no space in chunk cache");
         return;
      }
   }
#endif

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   if ((png_ptr->mode & PNG_HAVE_IDAT) != 0)
      png_ptr->mode |= PNG_AFTER_IDAT;

#ifdef PNG_MAX_MALLOC_64K
   if (length > 65535U)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "too large to fit in memory");
      return;
   }
#endif

   buffer = png_read_buffer(png_ptr, length+1, 1/*warn*/);

   if (buffer == NULL)
   {
      png_chunk_benign_error(png_ptr, "out of memory");
      return;
   }

   png_crc_read(png_ptr, buffer, length);

   if (png_crc_finish(png_ptr, skip) != 0)
      return;

   key = (png_charp)buffer;
   key[length] = 0;

   for (text = key; *text; text++)
      /* Empty loop to find end of key */ ;

   if (text != key + length)
      text++;

   text_info.compression = PNG_TEXT_COMPRESSION_NONE;
   text_info.key = key;
   text_info.lang = NULL;
   text_info.lang_key = NULL;
   text_info.itxt_length = 0;
   text_info.text = text;
   text_info.text_length = strlen(text);

   if (png_set_text_2(png_ptr, info_ptr, &text_info, 1) != 0)
      png_warning(png_ptr, "Insufficient memory to process text chunk");
}